

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *config_00;
  ulong uVar1;
  cmMakefile *this_01;
  char *pcVar2;
  cmCompiledGeneratorExpression *this_02;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  string local_1b8;
  undefined1 local_198 [16];
  char *processed;
  undefined1 local_168 [8];
  cmGeneratorExpression ge;
  string local_140;
  char *local_120;
  char *cflags;
  string local_110;
  undefined1 local_f0 [8];
  string includeFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_b0;
  string local_90;
  string *local_70;
  string *config;
  undefined1 local_58 [8];
  string language;
  cmGeneratorTarget *gtgt_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *flags;
  
  language.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmSourceFile::GetLanguage_abi_cxx11_((string *)local_58,source);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_58,"C");
  }
  this_01 = cmLocalGenerator::GetMakefile(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"CMAKE_BUILD_TYPE",
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = cmMakefile::GetSafeDefinition(this_01,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,pcVar2,
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_70 = &local_90;
  cmLocalGenerator::GetTargetCompileFlags
            (lg,gtgt,local_70,(string *)local_58,__return_storage_ptr__);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&includeFlags.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  cmLocalGenerator::GetIncludeDirectories(lg,this_00,gtgt,(string *)local_58,local_70,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",(allocator *)((long)&cflags + 7));
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_f0,lg,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&includeFlags.field_2 + 8),gtgt,(string *)local_58,true,false,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cflags + 7));
  (*lg->_vptr_cmLocalGenerator[6])(lg,__return_storage_ptr__,local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&includeFlags.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"COMPILE_FLAGS",(allocator *)((long)&ge.Backtrace.Cur + 7));
  pcVar2 = cmSourceFile::GetProperty(source,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ge.Backtrace.Cur + 7));
  local_120 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&processed);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_168,(cmListFileBacktrace *)&processed);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&processed);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_198,local_168);
    this_02 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_198);
    config_00 = local_70;
    std::__cxx11::string::string((string *)&local_1b8);
    pcVar3 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
             cmCompiledGeneratorExpression::Evaluate
                       (this_02,lg,config_00,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_198);
    local_198._8_8_ = pcVar3;
    (*lg->_vptr_cmLocalGenerator[7])(lg,__return_storage_ptr__,pcVar3);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_168);
  }
  language.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_58);
  if ((language.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetLanguage();
  if (language.empty()) {
    language = "C";
  }
  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add include directory flags.
  {
    std::vector<std::string> includes;
    lg->GetIncludeDirectories(includes, gtgt, language, config);
    std::string includeFlags = lg->GetIncludeFlags(includes, gtgt, language,
                                                   true); // full include paths
    lg->AppendFlags(flags, includeFlags);
  }

  // Add source file specific flags.
  if (const char* cflags = source->GetProperty("COMPILE_FLAGS")) {
    cmGeneratorExpression ge;
    const char* processed = ge.Parse(cflags)->Evaluate(lg, config);
    lg->AppendFlags(flags, processed);
  }

  return flags;
}